

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O3

int __thiscall OpenMD::RNEMD::RNEMD::getBin(RNEMD *this,Vector3d *pos)

{
  uint i;
  uint uVar1;
  long lVar2;
  double tmp;
  double dVar3;
  Vector<double,_3U> result;
  double local_28 [3];
  
  if (this->usePeriodicBoundaryConditions_ == true) {
    Snapshot::wrapVector(this->currentSnap_,pos);
    uVar1 = (uint)(int)(((pos->super_Vector<double,_3U>).data_[this->rnemdPrivilegedAxis_] /
                         *(double *)
                          ((long)(this->hmat_).super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_ +
                          (ulong)this->rnemdPrivilegedAxis_ * 0x20) + 0.5) * (double)this->nBins_) %
            this->nBins_;
  }
  else {
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    lVar2 = 0;
    do {
      local_28[lVar2] =
           (pos->super_Vector<double,_3U>).data_[lVar2] -
           (this->coordinateOrigin_).super_Vector<double,_3U>.data_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    dVar3 = 0.0;
    lVar2 = 0;
    do {
      dVar3 = dVar3 + local_28[lVar2] * local_28[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    uVar1 = (uint)(dVar3 / this->binWidth_);
  }
  return uVar1;
}

Assistant:

int RNEMD::getBin(Vector3d pos) {
    if (usePeriodicBoundaryConditions_) {
      currentSnap_->wrapVector(pos);

      return int(nBins_ *
                 (pos[rnemdPrivilegedAxis_] /
                      hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) +
                  0.5)) %
             nBins_;
    } else {
      Vector3d rPos = pos - coordinateOrigin_;
      return int(rPos.length() / binWidth_);
    }
  }